

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.c
# Opt level: O1

int compare_distance(void *a,void *b)

{
  int iVar1;
  
  iVar1 = 1;
  if (*a - *b < 1) {
    iVar1 = *a - *b >> 0x1f;
  }
  return iVar1;
}

Assistant:

static int compare_distance(const void *a, const void *b) {
  const int diff =
      ((FrameDistPair *)a)->distance - ((FrameDistPair *)b)->distance;
  if (diff > 0)
    return 1;
  else if (diff < 0)
    return -1;
  return 0;
}